

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O2

int parser_key(sf_parser *sfp,sf_vec *dest)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar1 = sfp->pos;
  if ((0x19 < *pbVar1 - 0x61) && (*pbVar1 != 0x2a)) {
    return -1;
  }
  pbVar2 = pbVar1;
  while( true ) {
    pbVar2 = pbVar2 + 1;
    sfp->pos = pbVar2;
    pbVar3 = sfp->end;
    if (pbVar2 == sfp->end) break;
    pbVar3 = pbVar2;
    switch(*pbVar2) {
    case 0x2a:
    case 0x2d:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x5f:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
      break;
    default:
      goto switchD_00115b7c_caseD_2b;
    }
  }
switchD_00115b7c_caseD_2b:
  if (dest != (sf_vec *)0x0) {
    dest->base = pbVar1;
    dest->len = (long)pbVar3 - (long)pbVar1;
  }
  return 0;
}

Assistant:

static int parser_key(sf_parser *sfp, sf_vec *dest) {
  const uint8_t *base;

  switch (*sfp->pos) {
  case '*':
  LCALPHA_CASES:
    break;
  default:
    return SF_ERR_PARSE_ERROR;
  }

  base = sfp->pos++;

  for (; !parser_eof(sfp); ++sfp->pos) {
    switch (*sfp->pos) {
    case '_':
    case '-':
    case '.':
    case '*':
    DIGIT_CASES:
    LCALPHA_CASES:
      continue;
    }

    break;
  }

  if (dest) {
    dest->base = (uint8_t *)base;
    dest->len = (size_t)(sfp->pos - dest->base);
  }

  return 0;
}